

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::srgb_decode_texparameterfv
               (NegativeTestContext *ctx)

{
  bool bVar1;
  NotSupportedError *this;
  allocator<char> local_61;
  GLuint texture;
  GLfloat local_5c;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"GL_EXT_texture_sRGB_decode",(allocator<char> *)&local_58);
  bVar1 = NegativeTestContext::isExtensionSupported(ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    texture = 0x1234;
    glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,1,&texture);
    glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0xde1,texture);
    local_5c = -1.0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,
               "GL_INVALID_ENUM is generated if pname is GL_TEXTURE_SRGB_DECODE_EXT and the value of param(s) is not a valid value (one of DECODE_EXT, or SKIP_DECODE_EXT)."
               ,&local_61);
    NegativeTestContext::beginSection(ctx,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    glu::CallLogWrapper::glTexParameterfv(&ctx->super_CallLogWrapper,0xde1,0x8a48,&local_5c);
    NegativeTestContext::expectError(ctx,0x500);
    NegativeTestContext::endSection(ctx);
    glu::CallLogWrapper::glDeleteTextures(&ctx->super_CallLogWrapper,1,&texture);
    return;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,"GL_EXT_texture_sRGB_decode is not supported.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeTextureApiTests.cpp"
             ,0xf86);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void srgb_decode_texparameterfv (NegativeTestContext& ctx)
{
	if (!ctx.isExtensionSupported("GL_EXT_texture_sRGB_decode"))
		TCU_THROW(NotSupportedError, "GL_EXT_texture_sRGB_decode is not supported.");

	GLfloat	params[1]	= {GL_LINEAR};
	GLuint	texture		= 0x1234;

	ctx.glGenTextures(1, &texture);
	ctx.glBindTexture(GL_TEXTURE_2D, texture);

	params[0] = -1.0f;
	ctx.beginSection("GL_INVALID_ENUM is generated if pname is GL_TEXTURE_SRGB_DECODE_EXT and the value of param(s) is not a valid value (one of DECODE_EXT, or SKIP_DECODE_EXT).");
	ctx.glTexParameterfv(GL_TEXTURE_2D, GL_TEXTURE_SRGB_DECODE_EXT, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.glDeleteTextures(1, &texture);
}